

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O1

bool __thiscall
JsUtil::
BaseDictionary<unsigned_short,_int,_Memory::JitArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::ContainsKey(BaseDictionary<unsigned_short,_int,_Memory::JitArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              *this,unsigned_short *key)

{
  Type piVar1;
  hash_t hVar2;
  uint depth;
  Type this_00;
  uint uVar3;
  
  piVar1 = this->buckets;
  depth = 0;
  if (piVar1 != (Type)0x0) {
    hVar2 = PrimePolicy::ModPrime((uint)*key,this->bucketCount,this->modFunctionIndex);
    uVar3 = piVar1[hVar2];
    depth = 0;
    if (-1 < (int)uVar3) {
      depth = 0;
      do {
        if (this->entries[uVar3].
            super_DefaultHashedEntry<unsigned_short,_int,_JsUtil::(anonymous_namespace)::KeyValueEntry>
            .super_KeyValueEntry<unsigned_short,_int>.
            super_ValueEntry<int,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_short,_int>_>
            .super_KeyValueEntryDataLayout2<unsigned_short,_int>.key == *key) {
          this_00 = this->stats;
          goto LAB_0055fe61;
        }
        depth = depth + 1;
        uVar3 = this->entries[uVar3].
                super_DefaultHashedEntry<unsigned_short,_int,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                .super_KeyValueEntry<unsigned_short,_int>.
                super_ValueEntry<int,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_short,_int>_>
                .super_KeyValueEntryDataLayout2<unsigned_short,_int>.next;
      } while (-1 < (int)uVar3);
    }
  }
  this_00 = this->stats;
  uVar3 = 0xffffffff;
LAB_0055fe61:
  if (this_00 != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(this_00,depth);
  }
  return -1 < (int)uVar3;
}

Assistant:

bool ContainsKey(const TKey& key) const
        {
            return FindEntry(key) >= 0;
        }